

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

ostream * libDAI::operator<<(ostream *os,FactorGraph *fg)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  size_t k_1;
  long lVar5;
  size_t k;
  ulong uVar6;
  size_t I;
  ulong uVar7;
  char buf [20];
  char acStack_48 [24];
  
  (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar7 = 0;
  while( true ) {
    iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[9])(fg);
    if (CONCAT44(extraout_var,iVar3) <= uVar7) break;
    std::endl<char,std::char_traits<char>>(os);
    (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
    lVar5 = *(long *)CONCAT44(extraout_var_00,iVar3);
    while( true ) {
      iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
      if (lVar5 == *(long *)(CONCAT44(extraout_var_01,iVar3) + 8)) break;
      poVar4 = std::ostream::_M_insert<long>((long)os);
      std::operator<<(poVar4," ");
      lVar5 = lVar5 + 0x10;
    }
    std::endl<char,std::char_traits<char>>(os);
    iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
    lVar5 = *(long *)CONCAT44(extraout_var_02,iVar3);
    while( true ) {
      iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
      if (lVar5 == *(long *)(CONCAT44(extraout_var_03,iVar3) + 8)) break;
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::operator<<(poVar4," ");
      lVar5 = lVar5 + 0x10;
    }
    std::endl<char,std::char_traits<char>>(os);
    uVar6 = 0;
    while( true ) {
      iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_04,iVar3) + 0x28) -
                  *(long *)(CONCAT44(extraout_var_04,iVar3) + 0x20) >> 3) <= uVar6) break;
      iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(*(long *)(CONCAT44(extraout_var_05,iVar3) + 0x20) + uVar6 * 8);
      vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar2,4);
      uVar6 = uVar6 + 1;
    }
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar6 = 0;
    while( true ) {
      iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_06,iVar3) + 0x28) -
                  *(long *)(CONCAT44(extraout_var_06,iVar3) + 0x20) >> 3) <= uVar6) break;
      iVar3 = (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
      dVar1 = *(double *)(*(long *)(CONCAT44(extraout_var_07,iVar3) + 0x20) + uVar6 * 8);
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        (*(fg->super_GraphicalModel)._vptr_GraphicalModel[10])(fg,uVar7);
        sprintf(acStack_48,"%18.14g");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,acStack_48);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      uVar6 = uVar6 + 1;
    }
    uVar7 = uVar7 + 1;
  }
  return os;
}

Assistant:

std::ostream& operator << (std::ostream& os, const FactorGraph& fg) {
        os << fg.nrFactors() << endl;

        for( size_t I = 0; I < fg.nrFactors(); I++ ) {
            os << endl;
            os << fg.factor(I).vars().size() << endl;
            for( VarSet::const_iterator i = fg.factor(I).vars().begin(); i != fg.factor(I).vars().end(); i++ )
                os << i->label() << " ";
            os << endl;
            for( VarSet::const_iterator i = fg.factor(I).vars().begin(); i != fg.factor(I).vars().end(); i++ )
                os << i->states() << " ";
            os << endl;
            size_t nr_nonzeros = 0;
            for( size_t k = 0; k < fg.factor(I).stateSpace(); k++ )
                if( fg.factor(I)[k] != 0.0 )
                    nr_nonzeros++;
            os << nr_nonzeros << endl;
            for( size_t k = 0; k < fg.factor(I).stateSpace(); k++ )
                if( fg.factor(I)[k] != 0.0 ) {
                    char buf[20];
                    sprintf(buf,"%18.14g", fg.factor(I)[k]);
                    os << k << " " << buf << endl;
                }
        }

        return(os);
    }